

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::CloneTopOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack)

{
  Frag *pFVar1;
  State *__dest;
  State *__src;
  Frag local_40;
  uint local_34;
  State *pSStack_30;
  SizeType j;
  State *s;
  SizeType count;
  Frag src;
  Stack<rapidjson::CrtAllocator> *operandStack_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  src._4_8_ = operandStack;
  pFVar1 = Stack<rapidjson::CrtAllocator>::
           Top<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack);
  s._4_4_ = pFVar1->start;
  count = pFVar1->out;
  src.start = pFVar1->minIndex;
  s._0_4_ = this->stateCount_ - src.start;
  __dest = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,(ulong)(uint)s);
  pSStack_30 = __dest;
  __src = GetState(this,src.start);
  memcpy(__dest,__src,(ulong)(uint)s << 4);
  for (local_34 = 0; local_34 < (uint)s; local_34 = local_34 + 1) {
    if (pSStack_30[local_34].out != 0xffffffff) {
      pSStack_30[local_34].out = (uint)s + pSStack_30[local_34].out;
    }
    if (pSStack_30[local_34].out1 != 0xffffffff) {
      pSStack_30[local_34].out1 = (uint)s + pSStack_30[local_34].out1;
    }
  }
  Frag::Frag(&local_40,s._4_4_ + (uint)s,count + (uint)s,src.start + (uint)s);
  pFVar1 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     ((Stack<rapidjson::CrtAllocator> *)src._4_8_,1);
  pFVar1->start = local_40.start;
  pFVar1->out = local_40.out;
  pFVar1->minIndex = local_40.minIndex;
  this->stateCount_ = (uint)s + this->stateCount_;
  return;
}

Assistant:

void CloneTopOperand(Stack<Allocator>& operandStack) {
        const Frag src = *operandStack.template Top<Frag>(); // Copy constructor to prevent invalidation
        SizeType count = stateCount_ - src.minIndex; // Assumes top operand contains states in [src->minIndex, stateCount_)
        State* s = states_.template Push<State>(count);
        memcpy(s, &GetState(src.minIndex), count * sizeof(State));
        for (SizeType j = 0; j < count; j++) {
            if (s[j].out != kRegexInvalidState)
                s[j].out += count;
            if (s[j].out1 != kRegexInvalidState)
                s[j].out1 += count;
        }
        *operandStack.template Push<Frag>() = Frag(src.start + count, src.out + count, src.minIndex + count);
        stateCount_ += count;
    }